

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O0

size_t __thiscall xmrig::OclCnRunner::bufferSize(OclCnRunner *this)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  OclBaseRunner *in_RDI;
  
  sVar1 = OclBaseRunner::bufferSize(in_RDI);
  sVar2 = OclBaseRunner::align(in_RDI,sVar1);
  lVar3 = sVar1 + sVar2;
  sVar2 = OclBaseRunner::align(in_RDI,sVar1);
  sVar1 = OclBaseRunner::align(in_RDI,sVar1);
  return lVar3 + sVar2 + sVar1 * 4;
}

Assistant:

size_t xmrig::OclCnRunner::bufferSize() const
{
    return OclBaseRunner::bufferSize() +
           align(CnAlgo::CN_MEMORY * m_intensity) +
           align(200 * m_intensity) +
           (align(sizeof(cl_uint) * (m_intensity + 2)) * BRANCH_MAX);
}